

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void AnalyzeClassStaticIf
               (ExpressionContext *ctx,ExprClassDefinition *classDefinition,SynClassStaticIf *syntax
               ,bool baseElements)

{
  ExprBase *pEVar1;
  SynClassElements *syntax_00;
  
  pEVar1 = AnalyzeExpression(ctx,syntax->condition);
  pEVar1 = CreateConditionCast(ctx,pEVar1->source,pEVar1);
  pEVar1 = CreateCast(ctx,&syntax->super_SynBase,pEVar1,ctx->typeBool,false);
  pEVar1 = anon_unknown.dwarf_c3752::EvaluateExpression(ctx,&syntax->super_SynBase,pEVar1);
  if ((pEVar1 == (ExprBase *)0x0) || (pEVar1->typeID != 3)) {
    anon_unknown.dwarf_c3752::Report(ctx,&syntax->super_SynBase,"ERROR: can\'t get condition value")
    ;
    return;
  }
  if (pEVar1->field_0x29 == '\x01') {
    syntax_00 = syntax->trueBlock;
  }
  else {
    syntax_00 = syntax->falseBlock;
    if (syntax_00 == (SynClassElements *)0x0) {
      return;
    }
  }
  if (baseElements) {
    AnalyzeClassBaseElements(ctx,classDefinition,syntax_00);
    return;
  }
  AnalyzeClassFunctionElements(ctx,classDefinition,syntax_00);
  return;
}

Assistant:

void AnalyzeClassStaticIf(ExpressionContext &ctx, ExprClassDefinition *classDefinition, SynClassStaticIf *syntax, bool baseElements)
{
	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	if(ExprBoolLiteral *number = getType<ExprBoolLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, syntax, condition, ctx.typeBool, false))))
	{
		if(number->value)
		{
			if(baseElements)
				AnalyzeClassBaseElements(ctx, classDefinition, syntax->trueBlock);
			else
				AnalyzeClassFunctionElements(ctx, classDefinition, syntax->trueBlock);
		}
		else if(syntax->falseBlock)
		{
			if(baseElements)
				AnalyzeClassBaseElements(ctx, classDefinition, syntax->falseBlock);
			else
				AnalyzeClassFunctionElements(ctx, classDefinition, syntax->falseBlock);
		}
	}
	else
	{
		Report(ctx, syntax, "ERROR: can't get condition value");
	}
}